

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O0

bool HDFHDD::IsRecognised(string *path)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  undefined1 local_32 [8];
  RS_IDE sHeader;
  int h;
  string *path_local;
  
  sHeader.abReserved[3] = 0xff;
  sHeader.abReserved[4] = 0xff;
  sHeader.abReserved[5] = 0xff;
  sHeader.abReserved[6] = 0xff;
  unique0x100000f0 = path;
  memset(local_32,0,0x16);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  sHeader.abReserved._3_4_ = open64(pcVar2,2);
  if (sHeader.abReserved._3_4_ == -1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sHeader.abReserved._3_4_ = open64(pcVar2,0);
    if (sHeader.abReserved._3_4_ == -1) {
      return false;
    }
  }
  sVar3 = read(sHeader.abReserved._3_4_,local_32,0x16);
  if ((sVar3 == 0x16) && (iVar1 = memcmp(local_32,"RS-IDE",6), iVar1 == 0)) {
    close(sHeader.abReserved._3_4_);
    return true;
  }
  close(sHeader.abReserved._3_4_);
  return false;
}

Assistant:

bool HDFHDD::IsRecognised(const std::string& path)
{
    int h = -1;
    RS_IDE sHeader = {};

    // Open as read-write, falling back on read-only
    if ((h = open(path.c_str(), O_RDWR | O_BINARY)) == -1 &&
        (h = open(path.c_str(), O_RDONLY | O_BINARY)) == -1)
        return false;

    // Read the file header and check the signature string
    if (read(h, &sHeader, sizeof(sHeader)) != sizeof(sHeader) ||
        memcmp(sHeader.szSignature, "RS-IDE", sizeof(sHeader.szSignature)))
    {
        close(h);
        return false;
    }

    // Appears valid
    close(h);
    return true;
}